

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_glsl_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  CompilerError *pCVar1;
  SPIRType *pSVar2;
  SPIRType *type;
  BaseType basetype;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string local_60 [36];
  BaseType local_3c;
  BaseType local_38;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  GLSLstd450 op;
  uint32_t count_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerHLSL *this_local;
  
  int_type = eop;
  integer_width = count;
  _op = args;
  args_local._4_4_ = eop;
  local_18 = id;
  eop_local = result_type;
  _id_local = this;
  uint_type = CompilerGLSL::get_integer_width_for_glsl_instruction
                        (&this->super_CompilerGLSL,eop,args,count);
  local_38 = to_signed_basetype(uint_type);
  local_3c = to_unsigned_basetype(uint_type);
  switch(int_type) {
  case Boolean:
    local_75 = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"roundEven is not supported on HLSL.",&local_61);
    CompilerError::CompilerError(pCVar1,(string *)local_60);
    local_75 = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  default:
    CompilerGLSL::emit_glsl_op
              (&this->super_CompilerGLSL,eop_local,local_18,args_local._4_4_,_op,integer_width);
    break;
  case UInt64:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*_op,"frac");
    break;
  case Char:
  case Char|Void:
  case Image|UInt:
    local_9a = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_98,"Inverse hyperbolics are not supported on HLSL.",&local_99);
    CompilerError::CompilerError(pCVar1,(string *)local_98);
    local_9a = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case Image|Int64:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],"atan2");
    break;
  case 0x20:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*_op,"rsqrt");
    break;
  case 0x22:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if ((pSVar2->vecsize == 2) && (pSVar2->columns == 2)) {
      if ((this->requires_inverse_2x2 & 1U) == 0) {
        this->requires_inverse_2x2 = true;
        Compiler::force_recompile((Compiler *)this);
      }
    }
    else if ((pSVar2->vecsize == 3) && (pSVar2->columns == 3)) {
      if ((this->requires_inverse_3x3 & 1U) == 0) {
        this->requires_inverse_3x3 = true;
        Compiler::force_recompile((Compiler *)this);
      }
    }
    else if (((pSVar2->vecsize == 4) && (pSVar2->columns == 4)) &&
            ((this->requires_inverse_4x4 & 1U) == 0)) {
      this->requires_inverse_4x4 = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_Inverse");
    break;
  case 0x2e:
  case 0x2f:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],_op[2],"lerp");
    break;
  case 0x32:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],_op[2],"mad");
    break;
  case 0x36:
    if ((this->requires_snorm8_packing & 1U) == 0) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_packSnorm4x8");
    break;
  case 0x37:
    if ((this->requires_unorm8_packing & 1U) == 0) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_packUnorm4x8");
    break;
  case 0x38:
    if ((this->requires_snorm16_packing & 1U) == 0) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_packSnorm2x16");
    break;
  case 0x39:
    if ((this->requires_unorm16_packing & 1U) == 0) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_packUnorm2x16");
    break;
  case 0x3a:
    if ((this->requires_fp16_packing & 1U) == 0) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_packHalf2x16");
    break;
  case 0x3b:
  case 0x41:
    type._6_1_ = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&basetype,"packDouble2x32/unpackDouble2x32 not supported in HLSL.",
               (allocator *)((long)&type + 7));
    CompilerError::CompilerError(pCVar1,(string *)&basetype);
    type._6_1_ = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0x3c:
    if ((this->requires_snorm16_packing & 1U) == 0) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_unpackSnorm2x16");
    break;
  case 0x3d:
    if ((this->requires_unorm16_packing & 1U) == 0) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_unpackUnorm2x16");
    break;
  case 0x3e:
    if ((this->requires_fp16_packing & 1U) == 0) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_unpackHalf2x16");
    break;
  case 0x3f:
    if ((this->requires_snorm8_packing & 1U) == 0) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_unpackSnorm4x8");
    break;
  case 0x40:
    if ((this->requires_unorm8_packing & 1U) == 0) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"SPIRV_Cross_unpackUnorm4x8");
    break;
  case 0x45:
    pSVar2 = Compiler::expression_type((Compiler *)this,*_op);
    if (pSVar2->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*_op,"sign");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,local_18,args_local._4_4_,_op,integer_width);
    }
    break;
  case 0x46:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar2->vecsize == 1) {
      if ((this->requires_scalar_faceforward & 1U) == 0) {
        this->requires_scalar_faceforward = true;
        Compiler::force_recompile((Compiler *)this);
      }
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],_op[2],
                 "SPIRV_Cross_FaceForward");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,local_18,args_local._4_4_,_op,integer_width);
    }
    break;
  case 0x47:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar2->vecsize == 1) {
      if ((this->requires_scalar_reflect & 1U) == 0) {
        this->requires_scalar_reflect = true;
        Compiler::force_recompile((Compiler *)this);
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],"SPIRV_Cross_Reflect");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,local_18,args_local._4_4_,_op,integer_width);
    }
    break;
  case 0x48:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar2->vecsize == 1) {
      if ((this->requires_scalar_refract & 1U) == 0) {
        this->requires_scalar_refract = true;
        Compiler::force_recompile((Compiler *)this);
      }
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],_op[2],
                 "SPIRV_Cross_Refract");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,local_18,args_local._4_4_,_op,integer_width);
    }
    break;
  case 0x49:
    pSVar2 = Compiler::expression_type((Compiler *)this,*_op);
    type._0_4_ = *(BaseType *)&(pSVar2->super_IVariant).field_0xc;
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"firstbitlow",(BaseType)type,
               (BaseType)type);
    break;
  case 0x4a:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"firstbithigh",local_38,local_38);
    break;
  case 0x4b:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"firstbithigh",local_3c,local_3c);
    break;
  case 0x4c:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,"EvaluateAttributeAtCentroid");
    break;
  case 0x4d:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],"EvaluateAttributeAtSample")
    ;
    break;
  case 0x4e:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*_op,_op[1],"EvaluateAttributeSnapped");
  }
  return;
}

Assistant:

void CompilerHLSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;

	case GLSLstd450Fract:
		emit_unary_func_op(result_type, id, args[0], "frac");
		break;

	case GLSLstd450RoundEven:
		SPIRV_CROSS_THROW("roundEven is not supported on HLSL.");

	case GLSLstd450Acosh:
	case GLSLstd450Asinh:
	case GLSLstd450Atanh:
		SPIRV_CROSS_THROW("Inverse hyperbolics are not supported on HLSL.");

	case GLSLstd450FMix:
	case GLSLstd450IMix:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "lerp");
		break;

	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;

	case GLSLstd450Fma:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "mad");
		break;

	case GLSLstd450InterpolateAtCentroid:
		emit_unary_func_op(result_type, id, args[0], "EvaluateAttributeAtCentroid");
		break;
	case GLSLstd450InterpolateAtSample:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeAtSample");
		break;
	case GLSLstd450InterpolateAtOffset:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeSnapped");
		break;

	case GLSLstd450PackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packHalf2x16");
		break;

	case GLSLstd450UnpackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackHalf2x16");
		break;

	case GLSLstd450PackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packSnorm4x8");
		break;

	case GLSLstd450UnpackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackSnorm4x8");
		break;

	case GLSLstd450PackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packUnorm4x8");
		break;

	case GLSLstd450UnpackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackUnorm4x8");
		break;

	case GLSLstd450PackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packSnorm2x16");
		break;

	case GLSLstd450UnpackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackSnorm2x16");
		break;

	case GLSLstd450PackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packUnorm2x16");
		break;

	case GLSLstd450UnpackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackUnorm2x16");
		break;

	case GLSLstd450PackDouble2x32:
	case GLSLstd450UnpackDouble2x32:
		SPIRV_CROSS_THROW("packDouble2x32/unpackDouble2x32 not supported in HLSL.");

	case GLSLstd450FindILsb:
	{
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "firstbitlow", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", uint_type, uint_type);
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &type = get<SPIRType>(result_type);
		if (type.vecsize == 2 && type.columns == 2)
		{
			if (!requires_inverse_2x2)
			{
				requires_inverse_2x2 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 3 && type.columns == 3)
		{
			if (!requires_inverse_3x3)
			{
				requires_inverse_3x3 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 4 && type.columns == 4)
		{
			if (!requires_inverse_4x4)
			{
				requires_inverse_4x4 = true;
				force_recompile();
			}
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_Inverse");
		break;
	}

	case GLSLstd450Normalize:
		// HLSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_reflect)
			{
				requires_scalar_reflect = true;
				force_recompile();
			}
			emit_binary_func_op(result_type, id, args[0], args[1], "SPIRV_Cross_Reflect");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_refract)
			{
				requires_scalar_refract = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "SPIRV_Cross_Refract");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_faceforward)
			{
				requires_scalar_faceforward = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "SPIRV_Cross_FaceForward");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}